

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

int vector_resize(vector v,size_t size)

{
  int iVar1;
  
  iVar1 = 1;
  if (v != (vector)0x0) {
    if ((v->capacity < size) && (iVar1 = vector_reserve(v,size), iVar1 != 0)) {
      log_write_impl_va("metacall",0xc1,"vector_resize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
      return 1;
    }
    v->size = size;
    iVar1 = 0;
    if (size < v->capacity >> 3) {
      iVar1 = vector_reserve(v,size * 2);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int vector_resize(vector v, size_t size)
{
	if (v != NULL)
	{
		if (v->capacity < size)
		{
			if (vector_reserve(v, size) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return 1;
			}
		}

		v->size = size;

		if (v->size < v->capacity / VECTOR_CAPACITY_MIN_USED)
		{
			return vector_reserve(v, v->size * VECTOR_CAPACITY_INCREMENT);
		}

		return 0;
	}

	return 1;
}